

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::pushOpStack(VirtualMachine *this,Variable v)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_41;
  string local_40;
  VirtualMachine *local_20;
  VirtualMachine *this_local;
  Variable v_local;
  
  v_local._0_8_ = v.field_1;
  this_local._0_4_ = v.type;
  local_20 = this;
  bVar1 = std::operator==(&this->stackFrame,(nullptr_t)0x0);
  if (!bVar1) {
    peVar2 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->stackFrame);
    std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::push_back
              (&peVar2->opStack,(value_type *)&this_local);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"No active stack frame found to push op stack!",&local_41);
  panic(this,&local_40);
}

Assistant:

void runtime::VirtualMachine::pushOpStack(Variable v) {
  if (this->stackFrame == nullptr) {
    this->panic("No active stack frame found to push op stack!");
  }

  this->stackFrame->opStack.push_back(v);
}